

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

LY_ERR moveto_scnode(lyxp_set *set,lys_module *moveto_mod,char *ncname,lyxp_axis axis,
                    uint32_t options)

{
  lyxp_set_type lVar1;
  lyxp_node_type node_type;
  char *__s;
  char *name;
  LY_ERR LVar2;
  int *piVar3;
  lysc_node *plVar4;
  lysc_node *plVar5;
  lys_module *plVar6;
  lysc_node *plVar7;
  ulong uVar8;
  size_t prefix_len;
  size_t name_len;
  int iVar9;
  undefined4 in_register_0000000c;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  undefined8 uVar13;
  lysc_node *last;
  lyxp_node_type node_type_00;
  uint32_t uVar14;
  lysc_node *plVar15;
  lyxp_axis axis_00;
  lysc_node *local_90;
  lyxp_node_type iter_type;
  char local_7d;
  uint local_7c;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  uint32_t idx;
  uint32_t mod_idx;
  lys_module *local_58;
  ulong local_50;
  undefined8 local_48;
  lys_module *local_40;
  char *local_38;
  
  local_70 = CONCAT44(in_register_0000000c,axis);
  local_58 = (lys_module *)0x0;
  LVar2 = LY_SUCCESS;
  if ((options & 0x20) == 0) {
    lVar1 = set->type;
    local_40 = moveto_mod;
    local_38 = ncname;
    if ((ulong)lVar1 == 1) {
      local_50 = (ulong)set->used;
      LVar2 = LY_SUCCESS;
      if (local_50 != 0) {
        uVar11 = axis - LYXP_AXIS_CHILD;
        if (axis == LYXP_AXIS_ATTRIBUTE) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                        ,0x1926,"LY_ERR moveto_axis_scnode_next_in_ctx(int32_t *, enum lyxp_axis)");
        }
        local_78 = (ulong)(options >> 4 & 0x20 | options & 0x10);
        local_7d = (moveto_mod != (lys_module *)0x0 && ncname != (char *)0x0) && uVar11 < 2;
        uVar12 = 0;
        local_48 = 0;
        local_7c = uVar11;
        do {
          piVar3 = (int *)((long)(set->val).nodes + uVar12 * 0x18 + 0xc);
          local_68 = uVar12;
          if ((uVar11 < 8) || ((lyxp_axis)local_70 < 2)) {
            if (*piVar3 == -2) {
              iVar9 = -1;
            }
            else {
              if (*piVar3 != 2) goto LAB_001ada05;
              iVar9 = 0;
            }
LAB_001ad49f:
            *piVar3 = iVar9;
            local_90 = (lysc_node *)0x0;
            iter_type = LYXP_NODE_NONE;
            node_type_00 = LYXP_NODE_NONE;
LAB_001ad4b5:
            plVar5 = local_90;
            plVar7 = *(lysc_node **)((long)(set->val).nodes + uVar12 * 0x18);
            node_type = *(lyxp_node_type *)((long)(set->val).nodes + uVar12 * 0x18 + 8);
            uVar14 = (uint32_t)local_78;
            if (node_type_00 == LYXP_NODE_NONE) {
              LVar2 = moveto_axis_scnode_next_first
                                (&local_90,&iter_type,&local_58,&mod_idx,plVar7,node_type,
                                 (lyxp_axis)local_70,set,uVar14);
LAB_001ad552:
              if (LVar2 == LY_SUCCESS) goto LAB_001ad8fd;
              goto LAB_001ad992;
            }
            plVar4 = plVar7;
            switch(local_70 & 0xffffffff) {
            case 0:
              goto switchD_001ad4e7_caseD_0;
            case 1:
              if ((node_type_00 == node_type) && (local_90 == plVar7)) {
                axis_00 = LYXP_AXIS_ANCESTOR;
LAB_001ad792:
                iter_type = LYXP_NODE_NONE;
                local_90 = (lysc_node *)0x0;
                LVar2 = moveto_axis_scnode_next_first
                                  (&local_90,&iter_type,&local_58,&mod_idx,plVar7,node_type_00,
                                   axis_00,set,uVar14);
                goto LAB_001ad552;
              }
switchD_001ad4e7_caseD_0:
              if (node_type_00 != LYXP_NODE_ELEM) goto switchD_001ad4e7_caseD_8;
              if (local_90 == (lysc_node *)0x0) {
                plVar7 = (lysc_node *)0x0;
              }
              else {
                plVar7 = local_90->parent;
              }
              plVar5 = lysc_data_node(plVar7);
              plVar6 = local_58;
              if (plVar5 == (lysc_node *)0x0) {
                iter_type = set->root_type;
                local_90 = (lysc_node *)0x0;
                uVar11 = local_7c;
                if (iter_type != LYXP_NODE_NONE) goto LAB_001ad8fd;
                break;
              }
LAB_001ad8ea:
              local_58 = plVar6;
              iter_type = LYXP_NODE_ELEM;
              local_90 = plVar5;
LAB_001ad8fd:
              node_type_00 = iter_type;
              LVar2 = moveto_scnode_check(local_90,(lysc_node *)0x0,set,local_38,local_40);
              if (LVar2 == LY_SUCCESS) {
                LVar2 = lyxp_set_scnode_insert_node
                                  (set,local_90,node_type_00,(lyxp_axis)local_70,&idx);
                if (LVar2 != LY_SUCCESS) {
                  return LY_EMEM;
                }
                uVar8 = (ulong)idx;
                if (local_68 < uVar8 && idx < (uint)local_50) {
                  *(undefined4 *)((long)(set->val).nodes + uVar8 * 0x18 + 0xc) = 3;
                  local_48 = CONCAT71((int7)(uVar8 * 3 >> 8),1);
                }
              }
              goto LAB_001ad4b5;
            case 2:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                            ,0x1a4a,
                            "LY_ERR moveto_axis_scnode_next(const struct lysc_node **, enum lyxp_node_type *, const struct lys_module **, uint32_t *, const struct lysc_node *, enum lyxp_node_type, enum lyxp_axis, struct lyxp_set *, uint32_t)"
                           );
            case 3:
            case 7:
              goto switchD_001ad4e7_caseD_3;
            case 4:
            case 6:
              goto LAB_001ad632;
            case 5:
              if (node_type_00 == node_type && local_90 == plVar7) {
                axis_00 = LYXP_AXIS_DESCENDANT;
                goto LAB_001ad792;
              }
LAB_001ad632:
              last = local_90;
              plVar15 = (lysc_node *)0x0;
              if ((lyxp_axis)local_70 != 6) {
                plVar15 = plVar4;
              }
              if (local_90 == (lysc_node *)0x0) {
                __assert_fail("*iter",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                              ,0x1a0a,
                              "LY_ERR moveto_axis_scnode_next(const struct lysc_node **, enum lyxp_node_type *, const struct lys_module **, uint32_t *, const struct lysc_node *, enum lyxp_node_type, enum lyxp_axis, struct lyxp_set *, uint32_t)"
                             );
              }
              plVar5 = lysc_node_child(local_90);
              plVar6 = local_58;
              if (plVar5 == (lysc_node *)0x0) {
                if ((last == plVar15) ||
                   (plVar5 = lysc_data_node(last->parent), plVar5 == (lysc_node *)0x0)) {
switchD_001ad4e7_caseD_3:
                  plVar6 = local_58;
                  plVar5 = local_90;
                  if (local_58 == (lys_module *)0x0) {
                    if (local_90 == (lysc_node *)0x0) {
                      plVar4 = (lysc_node *)0x0;
                    }
                    else {
                      plVar4 = local_90->parent;
                    }
                    plVar4 = lysc_data_node(plVar4);
                    plVar5 = lys_getnext(plVar5,plVar4,local_90->module->compiled,(uint32_t)local_78
                                        );
                    plVar6 = local_58;
                    if (plVar5 == (lysc_node *)0x0) {
                      if (plVar7 == (lysc_node *)0x0) {
                        __assert_fail("scnode",
                                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                                      ,0x1a1b,
                                      "LY_ERR moveto_axis_scnode_next(const struct lysc_node **, enum lyxp_node_type *, const struct lys_module **, uint32_t *, const struct lysc_node *, enum lyxp_node_type, enum lyxp_axis, struct lyxp_set *, uint32_t)"
                                     );
                      }
                      if (((lyxp_axis)local_70 != 3) &&
                         (plVar7 = lysc_data_node(plVar7->parent), uVar8 = local_78,
                         plVar7 == (lysc_node *)0x0)) {
                        while( true ) {
                          if (local_90 == (lysc_node *)0x0) {
                            plVar7 = (lysc_node *)0x0;
                          }
                          else {
                            plVar7 = local_90->parent;
                          }
                          plVar7 = lysc_data_node(plVar7);
                          if (plVar7 == (lysc_node *)0x0) break;
                          if (local_90 == (lysc_node *)0x0) {
                            plVar7 = (lysc_node *)0x0;
                          }
                          else {
                            plVar7 = local_90->parent;
                          }
                          local_90 = lysc_data_node(plVar7);
                        }
                        plVar5 = lys_getnext(local_90,(lysc_node *)0x0,local_90->module->compiled,
                                             (uint32_t)uVar8);
LAB_001ad8de:
                        plVar6 = local_58;
                        if (plVar5 != (lysc_node *)0x0) goto LAB_001ad8ea;
                      }
                      goto switchD_001ad4e7_caseD_8;
                    }
                  }
                  else {
                    uVar14 = (uint32_t)local_78;
                    plVar5 = lys_getnext(local_90,(lysc_node *)0x0,local_58->compiled,uVar14);
                    if (plVar5 == (lysc_node *)0x0) {
                      do {
                        do {
                          plVar6 = ly_ctx_get_module_iter(set->ctx,&mod_idx);
                          if (plVar6 == (lys_module *)0x0) {
                            local_58 = (lys_module *)0x0;
                            goto switchD_001ad4e7_caseD_8;
                          }
                        } while (plVar6->compiled == (lysc_module *)0x0);
                        local_90 = (lysc_node *)0x0;
                        plVar5 = lys_getnext((lysc_node *)0x0,(lysc_node *)0x0,plVar6->compiled,
                                             uVar14);
                      } while (plVar5 == (lysc_node *)0x0);
                    }
                  }
                }
                else {
                  plVar5 = lysc_data_node(last->parent);
                  plVar5 = lys_getnext(last,plVar5,(lysc_module *)0x0,(uint32_t)local_78);
                  plVar6 = local_58;
                  if (plVar5 == (lysc_node *)0x0) {
                    do {
                      last = last->parent;
                      if (last == plVar15) goto switchD_001ad4e7_caseD_3;
                      if (last == (lysc_node *)0x0) {
                        plVar4 = lysc_data_node((lysc_node *)0x0);
                        plVar5 = (lysc_node *)0x0;
                        if (plVar4 == (lysc_node *)0x0) goto switchD_001ad4e7_caseD_3;
                      }
                      else {
                        plVar5 = lysc_data_node(last->parent);
                        if (plVar5 == (lysc_node *)0x0) goto switchD_001ad4e7_caseD_3;
                        plVar5 = last->parent;
                      }
                      plVar5 = lysc_data_node(plVar5);
                      plVar5 = lys_getnext(last,plVar5,(lysc_module *)0x0,(uint32_t)local_78);
                    } while ((last != (lysc_node *)0x0) && (plVar5 == (lysc_node *)0x0));
                    plVar6 = local_58;
                    if (plVar5 == (lysc_node *)0x0) goto switchD_001ad4e7_caseD_3;
                  }
                }
              }
              goto LAB_001ad8ea;
            case 9:
              plVar5 = (lysc_node *)0x0;
              do {
                plVar4 = plVar5;
                if (plVar7 == (lysc_node *)0x0) {
                  plVar5 = (lysc_node *)0x0;
                }
                else {
                  plVar5 = plVar7->parent;
                }
                plVar5 = lysc_data_node(plVar5);
                plVar5 = lys_getnext(plVar4,plVar5,plVar7->module->compiled,uVar14);
              } while ((plVar5 != (lysc_node *)0x0) && (plVar5 != plVar7));
              if (plVar4 == (lysc_node *)0x0) {
                __assert_fail("dfs_stop",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                              ,0x19fa,
                              "LY_ERR moveto_axis_scnode_next(const struct lysc_node **, enum lyxp_node_type *, const struct lys_module **, uint32_t *, const struct lysc_node *, enum lyxp_node_type, enum lyxp_axis, struct lyxp_set *, uint32_t)"
                             );
              }
              if (local_90 != plVar4) goto LAB_001ad632;
            default:
switchD_001ad4e7_caseD_8:
              local_90 = (lysc_node *)0x0;
              iter_type = LYXP_NODE_NONE;
LAB_001ad992:
              uVar11 = local_7c;
              if ((local_7d != '\0') && (*(int *)((long)(set->val).nodes + uVar12 * 0x18 + 8) == 3))
              {
                plVar7 = *(lysc_node **)((long)(set->val).nodes + uVar12 * 0x18);
                __s = local_40->name;
                prefix_len = strlen(__s);
                name = local_38;
                name_len = strlen(local_38);
                LVar2 = ly_nested_ext_schema
                                  ((lyd_node *)0x0,plVar7,__s,prefix_len,LY_VALUE_JSON,(void *)0x0,
                                   name,name_len,&local_90,(lysc_ext_instance **)0x0);
                uVar11 = local_7c;
                if (LVar2 == LY_SUCCESS) {
                  LVar2 = lyxp_set_scnode_insert_node
                                    (set,local_90,LYXP_NODE_ELEM,(lyxp_axis)local_70,&idx);
                  if (LVar2 != LY_SUCCESS) {
                    return LY_EMEM;
                  }
                  uVar12 = (ulong)idx;
                  uVar11 = local_7c;
                  if (local_68 < uVar12 && idx < (uint)local_50) {
                    *(undefined4 *)((long)(set->val).nodes + uVar12 * 0x18 + 0xc) = 3;
                    local_48 = CONCAT71((int7)(uVar12 * 3 >> 8),1);
                  }
                }
              }
              break;
            case 10:
              if (local_90 == (lysc_node *)0x0) {
                __assert_fail("*iter",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                              ,0x1a3d,
                              "LY_ERR moveto_axis_scnode_next(const struct lysc_node **, enum lyxp_node_type *, const struct lys_module **, uint32_t *, const struct lysc_node *, enum lyxp_node_type, enum lyxp_axis, struct lyxp_set *, uint32_t)"
                             );
              }
              plVar4 = lysc_data_node(local_90->parent);
              plVar5 = lys_getnext(plVar5,plVar4,local_90->module->compiled,(uint32_t)local_78);
              if (plVar5 == plVar7) goto switchD_001ad4e7_caseD_8;
              goto LAB_001ad8de;
            }
          }
          else if ((lyxp_axis)local_70 == 0xb) {
            iVar9 = 2;
            if ((*piVar3 == -2) || (*piVar3 == 2)) goto LAB_001ad49f;
          }
LAB_001ada05:
          uVar12 = local_68 + 1;
        } while (uVar12 != local_50);
        if ((char)local_48 == '\0') {
          LVar2 = LY_SUCCESS;
        }
        else {
          lVar10 = 0;
          do {
            if (*(int *)((long)&((set->val).nodes)->pos + lVar10) == 3) {
              *(undefined4 *)((long)&((set->val).nodes)->pos + lVar10) = 2;
            }
            lVar10 = lVar10 + 0x18;
            LVar2 = LY_SUCCESS;
          } while (local_50 * 0x18 != lVar10);
        }
      }
    }
    else {
      if (lVar1 < (LYXP_SET_STRING|LYXP_SET_SCNODE_SET)) {
        uVar13 = *(undefined8 *)(&DAT_001fe678 + (ulong)lVar1 * 8);
      }
      else {
        uVar13 = 0;
      }
      ly_vlog(set->ctx,(char *)0x0,LYVE_XPATH,"Cannot apply XPath operation %s on %s.",
              "path operator",uVar13);
      LVar2 = LY_EVALID;
    }
  }
  return LVar2;
}

Assistant:

static LY_ERR
moveto_scnode(struct lyxp_set *set, const struct lys_module *moveto_mod, const char *ncname, enum lyxp_axis axis,
        uint32_t options)
{
    ly_bool temp_ctx = 0;
    uint32_t getnext_opts, orig_used, i, mod_idx, idx;
    const struct lys_module *mod = NULL;
    const struct lysc_node *iter;
    enum lyxp_node_type iter_type;

    if (options & LYXP_SKIP_EXPR) {
        return LY_SUCCESS;
    }

    if (set->type != LYXP_SET_SCNODE_SET) {
        LOGVAL(set->ctx, LY_VCODE_XP_INOP_1, "path operator", print_set_type(set));
        return LY_EVALID;
    }

    /* getnext opts */
    getnext_opts = 0;
    if (options & LYXP_SCNODE_OUTPUT) {
        getnext_opts |= LYS_GETNEXT_OUTPUT;
    }
    if (options & LYXP_SCNODE_SCHEMAMOUNT) {
        getnext_opts |= LYS_GETNEXT_WITHSCHEMAMOUNT;
    }

    orig_used = set->used;
    for (i = 0; i < orig_used; ++i) {
        /* update in_ctx first */
        if (moveto_axis_scnode_next_in_ctx(&set->val.scnodes[i].in_ctx, axis)) {
            /* not usable, skip */
            continue;
        }

        iter = NULL;
        iter_type = 0;
        while (!moveto_axis_scnode_next(&iter, &iter_type, &mod, &mod_idx, set->val.scnodes[i].scnode,
                set->val.scnodes[i].type, axis, set, getnext_opts)) {
            if (moveto_scnode_check(iter, NULL, set, ncname, moveto_mod)) {
                continue;
            }

            /* insert */
            LY_CHECK_RET(lyxp_set_scnode_insert_node(set, iter, iter_type, axis, &idx));

            /* we need to prevent these nodes from being considered in this moveto */
            if ((idx < orig_used) && (idx > i)) {
                set->val.scnodes[idx].in_ctx = LYXP_SET_SCNODE_ATOM_NEW_CTX;
                temp_ctx = 1;
            }
        }

        if (moveto_mod && ncname && ((axis == LYXP_AXIS_DESCENDANT) || (axis == LYXP_AXIS_CHILD)) &&
                (set->val.scnodes[i].type == LYXP_NODE_ELEM) && !ly_nested_ext_schema(NULL, set->val.scnodes[i].scnode,
                moveto_mod->name, strlen(moveto_mod->name), LY_VALUE_JSON, NULL, ncname, strlen(ncname), &iter, NULL)) {
            /* there is a matching node from an extension, use it */
            LY_CHECK_RET(lyxp_set_scnode_insert_node(set, iter, LYXP_NODE_ELEM, axis, &idx));
            if ((idx < orig_used) && (idx > i)) {
                set->val.scnodes[idx].in_ctx = LYXP_SET_SCNODE_ATOM_NEW_CTX;
                temp_ctx = 1;
            }
        }
    }

    /* correct temporary in_ctx values */
    if (temp_ctx) {
        for (i = 0; i < orig_used; ++i) {
            if (set->val.scnodes[i].in_ctx == LYXP_SET_SCNODE_ATOM_NEW_CTX) {
                set->val.scnodes[i].in_ctx = LYXP_SET_SCNODE_ATOM_CTX;
            }
        }
    }

    return LY_SUCCESS;
}